

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderExecUtil::TessControlExecutor::execute
          (TessControlExecutor *this,int numValues,void **inputs,void **outputs)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  Functions *gl;
  void **outputs_local;
  void **inputs_local;
  int numValues_local;
  TessControlExecutor *this_local;
  long lVar5;
  
  iVar3 = (*((this->super_BufferIoExecutor).super_ShaderExecutor.m_renderCtx)->_vptr_RenderContext
            [3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  BufferIoExecutor::initBuffers(&this->super_BufferIoExecutor,numValues);
  BufferIoExecutor::uploadInputBuffer(&this->super_BufferIoExecutor,inputs,numValues);
  bVar2 = std::
          vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
          ::empty(&(this->super_BufferIoExecutor).super_ShaderExecutor.m_inputs);
  if (!bVar2) {
    pcVar1 = *(code **)(lVar5 + 0x48);
    dVar4 = BufferIoExecutor::getInputBuffer(&this->super_BufferIoExecutor);
    (*pcVar1)(0x90d2,0,dVar4);
  }
  pcVar1 = *(code **)(lVar5 + 0x48);
  dVar4 = BufferIoExecutor::getOutputBuffer(&this->super_BufferIoExecutor);
  (*pcVar1)(0x90d2,1,dVar4);
  (**(code **)(lVar5 + 0xfd8))(0x8e72,3);
  (**(code **)(lVar5 + 0x538))(0xe,0,numValues * 3);
  BufferIoExecutor::readOutputBuffer(&this->super_BufferIoExecutor,outputs,numValues);
  return;
}

Assistant:

void TessControlExecutor::execute (int numValues, const void* const* inputs, void* const* outputs)
{
	const glw::Functions&	gl	= m_renderCtx.getFunctions();

	initBuffers(numValues);

	// Setup input buffer & copy data
	uploadInputBuffer(inputs, numValues);

	if (!m_inputs.empty())
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, INPUT_BUFFER_BINDING, getInputBuffer());

	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, OUTPUT_BUFFER_BINDING, getOutputBuffer());

	// Render patches
	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	gl.drawArrays(GL_PATCHES, 0, 3*numValues);

	// Read back data
	readOutputBuffer(outputs, numValues);
}